

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::HairSetNode> *mesh,ssize_t id)

{
  RTCGeometryType RVar1;
  MaterialNode *pMVar2;
  pointer pvVar3;
  pointer pvVar4;
  ulong uVar5;
  long *plVar6;
  pointer vec;
  HairSetNode *pHVar7;
  runtime_error *this_00;
  char *pcVar8;
  pointer pHVar9;
  long *plVar10;
  int __oflag;
  int __oflag_00;
  char *__end;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  pointer pvVar11;
  pointer vec_00;
  string str_type;
  string str_subtype;
  vector<int,_std::allocator<int>_> hairid;
  vector<int,_std::allocator<int>_> indices;
  undefined1 *local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [16];
  Ref<embree::SceneGraph::MaterialNode> local_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  vector<int,_std::allocator<int>_> local_160;
  vector<int,_std::allocator<int>_> local_148;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"","");
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"","");
  RVar1 = mesh->ptr->type;
  pcVar8 = "bezier";
  switch(RVar1) {
  case RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE:
    pcVar8 = "bezier";
    break;
  case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE|RTC_GEOMETRY_TYPE_QUAD:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
switchD_001647d6_caseD_1b:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid curve type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE:
    pcVar8 = "bspline";
  case RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE:
    std::__cxx11::string::_M_replace((ulong)&local_1c8,0,local_1c0,(ulong)pcVar8);
    pcVar8 = "round";
    goto LAB_0016486f;
  case RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE:
    pcVar8 = "bspline";
    break;
  case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE:
    pcVar8 = "bspline";
  case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE:
    std::__cxx11::string::_M_replace((ulong)&local_1c8,0,local_1c0,(ulong)pcVar8);
    pcVar8 = "oriented";
    goto LAB_0016486f;
  default:
    if (RVar1 != RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE) goto switchD_001647d6_caseD_1b;
    pcVar8 = "linear";
  }
  std::__cxx11::string::_M_replace((ulong)&local_1c8,0,local_1c0,(ulong)pcVar8);
  pcVar8 = "flat";
LAB_0016486f:
  std::__cxx11::string::_M_replace
            ((ulong)&local_180,0,(char *)local_180._M_string_length,(ulong)pcVar8);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_148,
             (long)(mesh->ptr->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(mesh->ptr->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_1a0);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_160,
             (long)(mesh->ptr->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(mesh->ptr->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_1a0);
  pHVar9 = (mesh->ptr->hairs).
           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((mesh->ptr->hairs).
      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar9) {
    uVar5 = 0;
    do {
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5] = pHVar9[uVar5].vertex;
      local_160.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5] =
           (mesh->ptr->hairs).
           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5].id;
      uVar5 = uVar5 + 1;
      pHVar9 = (mesh->ptr->hairs).
               super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(mesh->ptr->hairs).
                                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar9 >> 3));
  }
  std::operator+(&local_50,"Curves type=\"",&local_180);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_120 = *plVar10;
    lStack_118 = plVar6[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar10;
    local_130 = (long *)*plVar6;
  }
  local_128 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_1c8);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_190 = *plVar10;
    lStack_188 = plVar6[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *plVar10;
    local_1a0 = (long *)*plVar6;
  }
  local_198 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_100 = *plVar10;
    uStack_f8 = (undefined4)plVar6[3];
    uStack_f4 = *(undefined4 *)((long)plVar6 + 0x1c);
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar10;
    local_110 = (long *)*plVar6;
  }
  local_108 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  open(this,(char *)&local_110,(int)id);
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pMVar2 = (mesh->ptr->material).ptr;
  local_1a8.ptr = pMVar2;
  if (pMVar2 != (MaterialNode *)0x0) {
    (*(pMVar2->super_Node).super_RefCount._vptr_RefCount[2])(pMVar2);
  }
  store(this,&local_1a8);
  if (pMVar2 != (MaterialNode *)0x0) {
    (*(pMVar2->super_Node).super_RefCount._vptr_RefCount[3])(pMVar2);
  }
  if ((long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->ptr->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"animated_positions","");
    open(this,(char *)local_70,__oflag);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  vec = (mesh->ptr->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (mesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar11 = vec;
  if (vec != pvVar3) {
    do {
      store(this,"positions",vec);
      vec = vec + 1;
    } while (vec != pvVar3);
    vec = (mesh->ptr->positions).
          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    pvVar11 = (mesh->ptr->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((long)vec - (long)pvVar11 != 0x20) {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"animated_positions","");
    close(this,(int)local_90);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
  }
  pHVar7 = mesh->ptr;
  if ((pHVar7->normals).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pHVar7->normals).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((long)(pHVar7->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pHVar7->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"animated_normals","");
      open(this,(char *)local_b0,__oflag_00);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
    }
    pHVar7 = mesh->ptr;
    vec_00 = (pHVar7->normals).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (pHVar7->normals).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (vec_00 != pvVar4) {
      do {
        store(this,"normals",vec_00);
        vec_00 = vec_00 + 1;
      } while (vec_00 != pvVar4);
      pHVar7 = mesh->ptr;
    }
    if ((long)(pHVar7->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pHVar7->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"animated_normals","");
      close(this,(int)local_d0);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0]);
      }
    }
  }
  store<int>(this,"indices",&local_148);
  store<int>(this,"hairid",&local_160);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Curves","");
  close(this,(int)local_f0);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  if (local_160.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::HairSetNode> mesh, ssize_t id)
  {
    std::string str_type = "";
    std::string str_subtype = "";

    switch (mesh->type) {
    case RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE:
      str_type = "linear";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "round";
      break;

    case RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "oriented";
      break;

    case RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "round";
      break;

    case RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "oriented";
      break;

    default:
      throw std::runtime_error("invalid curve type");
    }

    std::vector<int> indices(mesh->hairs.size());
    std::vector<int> hairid(mesh->hairs.size());
    for (size_t i=0; i<mesh->hairs.size(); i++) {
      indices[i] = mesh->hairs[i].vertex;
      hairid[i] = mesh->hairs[i].id;
    }
    
    open("Curves type=\""+str_subtype+"\" basis=\""+str_type+"\"",id);
    store(mesh->material);
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");
    if (mesh->normals.size()) {
      if (mesh->numTimeSteps() != 1) open("animated_normals");
      for (const auto& p : mesh->normals) store("normals",p);
      if (mesh->numTimeSteps() != 1) close("animated_normals");
    }
    store("indices",indices);
    store("hairid",hairid);
    close("Curves");
  }